

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O1

void __thiscall Zippy::ZipArchive::Close(ZipArchive *this)

{
  pointer pZVar1;
  pointer pZVar2;
  pointer pZVar3;
  
  if (this->m_IsOpen == true) {
    mz_zip_reader_end_internal(&this->m_Archive,1);
  }
  pZVar1 = (this->m_ZipEntries).
           super__Vector_base<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>._M_impl
           .super__Vector_impl_data._M_start;
  pZVar2 = (this->m_ZipEntries).
           super__Vector_base<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pZVar3 = pZVar1;
  if (pZVar2 != pZVar1) {
    do {
      (**pZVar3->_vptr_ZipEntry)(pZVar3);
      pZVar3 = pZVar3 + 1;
    } while (pZVar3 != pZVar2);
    (this->m_ZipEntries).
    super__Vector_base<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = pZVar1;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->m_ArchivePath,0,(this->m_ArchivePath)._M_string_length,"",0);
  return;
}

Assistant:

void Close() {

            if (IsOpen())
                mz_zip_reader_end(&m_Archive);
            m_ZipEntries.clear();
            m_ArchivePath = "";
        }